

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

char * getF(lua_State *L,void *ud,size_t *size)

{
  int iVar1;
  size_t sVar2;
  lua_State *local_38;
  LoadF *lf;
  size_t *size_local;
  void *ud_local;
  lua_State *L_local;
  
  if (*ud == 0) {
    iVar1 = feof(*(FILE **)((long)ud + 8));
    if (iVar1 == 0) {
      sVar2 = fread((void *)((long)ud + 0x10),1,0x2000,*(FILE **)((long)ud + 8));
      *size = sVar2;
      if (*size == 0) {
        local_38 = (lua_State *)0x0;
      }
      else {
        local_38 = (lua_State *)((long)ud + 0x10);
      }
      L_local = local_38;
    }
    else {
      L_local = (lua_State *)0x0;
    }
  }
  else {
    *(undefined4 *)ud = 0;
    *size = 1;
    L_local = (lua_State *)0x11fad5;
  }
  return (char *)L_local;
}

Assistant:

static const char*getF(lua_State*L,void*ud,size_t*size){
LoadF*lf=(LoadF*)ud;
(void)L;
if(lf->extraline){
lf->extraline=0;
*size=1;
return"\n";
}
if(feof(lf->f))return NULL;
*size=fread(lf->buff,1,sizeof(lf->buff),lf->f);
return(*size>0)?lf->buff:NULL;
}